

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_extra_test.cc
# Opt level: O2

UniquePtr<EVP_PKEY> LoadExampleRSAKey(void)

{
  int iVar1;
  __uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true> in_RDI;
  UniquePtr<EVP_PKEY> pkey;
  UniquePtr<RSA> rsa;
  _Head_base<0UL,_evp_pkey_st_*,_false> local_18;
  _Head_base<0UL,_rsa_st_*,_false> local_10;
  
  local_10._M_head_impl = RSA_private_key_from_bytes(kExampleRSAKeyDER,0x260);
  if (local_10._M_head_impl == (RSA *)0x0) {
    *(undefined8 *)
     in_RDI.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
     super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
     super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl = 0;
    goto LAB_00248e41;
  }
  local_18._M_head_impl = (evp_pkey_st *)EVP_PKEY_new();
  if ((EVP_PKEY *)local_18._M_head_impl == (EVP_PKEY *)0x0) {
LAB_00248e2f:
    *(undefined8 *)
     in_RDI.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
     super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
     super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl = 0;
  }
  else {
    iVar1 = EVP_PKEY_set1_RSA((EVP_PKEY *)local_18._M_head_impl,(rsa_st *)local_10._M_head_impl);
    if (iVar1 == 0) goto LAB_00248e2f;
    *(evp_pkey_st **)
     in_RDI.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
     super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
     super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl = local_18._M_head_impl;
    local_18._M_head_impl = (evp_pkey_st *)0x0;
  }
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&local_18);
LAB_00248e41:
  std::unique_ptr<rsa_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<rsa_st,_bssl::internal::Deleter> *)&local_10);
  return (__uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true>)
         (tuple<evp_pkey_st_*,_bssl::internal::Deleter>)
         in_RDI.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl;
}

Assistant:

static bssl::UniquePtr<EVP_PKEY> LoadExampleRSAKey() {
  bssl::UniquePtr<RSA> rsa(RSA_private_key_from_bytes(kExampleRSAKeyDER,
                                           sizeof(kExampleRSAKeyDER)));
  if (!rsa) {
    return nullptr;
  }
  bssl::UniquePtr<EVP_PKEY> pkey(EVP_PKEY_new());
  if (!pkey || !EVP_PKEY_set1_RSA(pkey.get(), rsa.get())) {
    return nullptr;
  }
  return pkey;
}